

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeInsertCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iHeight)

{
  i64 *piVar1;
  RtreeDValue *aDistance;
  undefined8 *puVar2;
  RtreeCoord *pRVar3;
  float fVar4;
  float fVar5;
  RtreeDValue RVar6;
  byte bVar7;
  u8 uVar8;
  RtreeNode *pNode_00;
  double dVar9;
  RtreeDValue RVar10;
  double dVar11;
  double dVar12;
  RtreeCoord RVar13;
  RtreeCoord RVar14;
  RtreeCoord RVar15;
  RtreeCoord RVar16;
  i64 iVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 pNode_01 [8];
  int iVar22;
  int iVar23;
  int iVar24;
  RtreeCell *pRVar25;
  RtreeNode *pRVar26;
  RtreeNode *pNode_02;
  void *pvVar27;
  i64 iVar28;
  u8 *puVar29;
  byte bVar30;
  ulong uVar31;
  ushort uVar32;
  u64 n;
  uint uVar33;
  ulong uVar34;
  RtreeCell *pRVar35;
  int *piVar36;
  void *pvVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  uint uVar41;
  bool bVar42;
  double dVar43;
  RtreeCell leftbbox;
  RtreeCell rightbbox;
  long local_160;
  int local_13c;
  int local_12c;
  RtreeCell *local_128;
  RtreeDValue local_120;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  RtreeCoord aRStack_f0 [2];
  ulong local_e8;
  RtreeDValue local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [8];
  RtreeCoord RStack_c0;
  float fStack_bc;
  RtreeCoord local_b8 [2];
  RtreeCoord aRStack_b0 [2];
  RtreeCoord local_a8 [2];
  RtreeCoord aRStack_a0 [2];
  long local_98;
  RtreeNode *local_90;
  long local_88;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  ulong local_60;
  ulong local_58;
  double local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  
  if (0 < iHeight) {
    uVar39 = pCell->iRowid;
    iVar22 = (int)((uVar39 & 0xffffffff) * 0x51d07eaf >> 0x20);
    for (pRVar26 = pRtree->aHash
                   [(int)uVar39 + (((uint)((int)uVar39 - iVar22) >> 1) + iVar22 >> 6) * -0x61];
        (pRVar26 != (RtreeNode *)0x0 && (pRVar26->iNode != uVar39)); pRVar26 = pRVar26->pNext) {
    }
    if (pRVar26 != (RtreeNode *)0x0) {
      nodeRelease(pRtree,pRVar26->pParent);
      if (pNode != (RtreeNode *)0x0) {
        pNode->nRef = pNode->nRef + 1;
      }
      pRVar26->pParent = pNode;
    }
  }
  iVar22 = nodeInsertCell(pRtree,pNode,pCell);
  if (iVar22 == 0) {
    iVar22 = AdjustTree(pRtree,pNode,pCell);
    if (iVar22 != 0) {
      return iVar22;
    }
    if (iHeight != 0) {
      iVar22 = parentWrite(pRtree,pCell->iRowid,pNode->iNode);
      return iVar22;
    }
    iVar22 = rowidWrite(pRtree,pCell->iRowid,pNode->iNode);
    return iVar22;
  }
  local_128 = pCell;
  if ((pRtree->iReinsertHeight < iHeight) && (pNode->iNode != 1)) {
    pRtree->iReinsertHeight = iHeight;
    local_108._0_4_ = (RtreeCoord)0x0;
    local_108._4_4_ = (RtreeCoord)0x0;
    uStack_100._0_4_ = (RtreeCoord)0x0;
    uStack_100._4_4_ = (RtreeCoord)0x0;
    local_118 = (undefined1  [8])0x0;
    uStack_110._0_4_ = (RtreeCoord)0x0;
    uStack_110._4_4_ = (RtreeCoord)0x0;
    local_f8._0_4_ = (RtreeCoord)0x0;
    local_f8._4_4_ = (RtreeCoord)0x0;
    lVar38 = (ulong)pNode->zData[2] << 8;
    bVar7 = pNode->zData[3];
    iVar22 = (int)lVar38;
    uVar41 = iVar22 + (uint)bVar7 + 2 & 0xfffffffe;
    iVar23 = sqlite3_initialize();
    if (iVar23 == 0) {
      pvVar27 = sqlite3Malloc((ulong)(uVar41 << 6));
    }
    else {
      pvVar27 = (void *)0x0;
    }
    if (pvVar27 == (void *)0x0) {
      return 7;
    }
    uVar33 = iVar22 + (uint)bVar7;
    iVar23 = iVar22 + (uint)bVar7 + 1;
    piVar36 = (int *)((ulong)(uVar41 * 0x30) + (long)pvVar27);
    local_78 = (double)(ulong)uVar41;
    local_e0 = (RtreeDValue)lVar38;
    uVar39 = (ulong)(iVar22 + (uint)bVar7 + 1);
    lVar38 = (long)pvVar27 + 0xc;
    uVar40 = 0;
    local_120 = (RtreeDValue)(ulong)bVar7;
    do {
      pRVar25 = (RtreeCell *)(uVar40 * 0x30 + (long)pvVar27);
      if (uVar40 == uVar33) {
        iVar28 = pCell->iRowid;
        uVar18 = *(undefined8 *)pCell->aCoord;
        uVar19 = *(undefined8 *)(pCell->aCoord + 2);
        uVar20 = *(undefined8 *)(pCell->aCoord + 4);
        uVar21 = *(undefined8 *)(pCell->aCoord + 8);
        *(undefined8 *)(pRVar25->aCoord + 6) = *(undefined8 *)(pCell->aCoord + 6);
        *(undefined8 *)(pRVar25->aCoord + 8) = uVar21;
        *(undefined8 *)(pRVar25->aCoord + 2) = uVar19;
        *(undefined8 *)(pRVar25->aCoord + 4) = uVar20;
        pRVar25->iRowid = iVar28;
        *(undefined8 *)pRVar25->aCoord = uVar18;
      }
      else {
        nodeGetCell(pRtree,pNode,(int)uVar40,pRVar25);
      }
      pRVar25 = local_128;
      piVar36[uVar40] = (int)uVar40;
      bVar7 = pRtree->nDim;
      if ((ulong)bVar7 != 0) {
        uVar8 = pRtree->eCoordType;
        uVar34 = 0;
        do {
          if (uVar8 == '\0') {
            dVar43 = (double)*(float *)(lVar38 + -4 + uVar34 * 8);
          }
          else {
            dVar43 = (double)*(int *)(lVar38 + -4 + uVar34 * 8);
          }
          dVar12 = *(double *)(local_118 + uVar34 * 8);
          *(double *)(local_118 + uVar34 * 8) = dVar43 + dVar12;
          if (uVar8 == '\0') {
            dVar9 = (double)*(float *)(lVar38 + uVar34 * 8);
          }
          else {
            dVar9 = (double)*(int *)(lVar38 + uVar34 * 8);
          }
          *(double *)(local_118 + uVar34 * 8) = dVar43 + dVar12 + dVar9;
          uVar34 = uVar34 + 1;
        } while (bVar7 != uVar34);
      }
      uVar40 = uVar40 + 1;
      lVar38 = lVar38 + 0x30;
      pCell = local_128;
    } while (uVar40 != uVar39);
    uVar40 = (ulong)pRtree->nDim;
    if (uVar40 != 0) {
      uVar34 = 0;
      do {
        *(double *)(local_118 + uVar34 * 8) =
             *(double *)(local_118 + uVar34 * 8) / (double)(iVar23 * 2);
        uVar34 = uVar34 + 1;
      } while (uVar40 != uVar34);
    }
    RVar10 = local_e0;
    aDistance = (RtreeDValue *)(piVar36 + uVar41 + (long)local_78);
    lVar38 = (long)pvVar27 + 0xc;
    uVar34 = 0;
    do {
      aDistance[uVar34] = 0.0;
      if (uVar40 != 0) {
        uVar8 = pRtree->eCoordType;
        RVar6 = aDistance[uVar34];
        uVar31 = 0;
        do {
          if (uVar8 == '\0') {
            dVar43 = (double)*(float *)(lVar38 + uVar31 * 8);
            dVar12 = (double)*(float *)(lVar38 + -4 + uVar31 * 8);
          }
          else {
            dVar43 = (double)*(int *)(lVar38 + uVar31 * 8);
            dVar12 = (double)*(int *)(lVar38 + -4 + uVar31 * 8);
          }
          dVar43 = (dVar43 - dVar12) - *(double *)(local_118 + uVar31 * 8);
          RVar6 = RVar6 + dVar43 * dVar43;
          aDistance[uVar34] = RVar6;
          uVar31 = uVar31 + 1;
        } while (uVar40 != uVar31);
      }
      uVar34 = uVar34 + 1;
      lVar38 = lVar38 + 0x30;
    } while (uVar34 != uVar39);
    SortByDistance(piVar36,iVar23,aDistance,piVar36 + uVar41);
    uVar39 = 0;
    memset(pNode->zData + 2,0,(long)pRtree->iNodeSize - 2);
    pNode->isDirty = 1;
    iVar22 = SUB84(local_120,0);
    do {
      iVar23 = (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell;
      iVar23 = (int)((ulong)((long)iVar23 * 0x55555555) >> 0x20) - iVar23;
      if ((long)(int)(((iVar23 >> 1) - (iVar23 >> 0x1f)) + uVar33) <= (long)uVar39) {
        iVar23 = fixBoundingBox(pRtree,pNode);
        break;
      }
      lVar38 = (long)*(int *)((long)pvVar27 +
                             uVar39 * 4 + (ulong)(iVar22 + SUB84(RVar10,0) + 2U >> 1) * 0x60) * 0x30
      ;
      nodeInsertCell(pRtree,pNode,(RtreeCell *)((long)pvVar27 + lVar38));
      lVar38 = *(long *)((long)pvVar27 + lVar38);
      iVar23 = 0;
      if (lVar38 == pRVar25->iRowid) {
        if (iHeight == 0) {
          iVar23 = rowidWrite(pRtree,lVar38,pNode->iNode);
        }
        else {
          iVar23 = parentWrite(pRtree,lVar38,pNode->iNode);
        }
      }
      uVar39 = uVar39 + 1;
    } while (iVar23 == 0);
    if ((iVar23 == 0) && ((uint)uVar39 <= uVar33)) {
      iVar22 = SUB84(local_120,0);
      uVar39 = uVar39 & 0xffffffff;
      do {
        pRVar25 = (RtreeCell *)
                  ((long)*(int *)((long)pvVar27 +
                                 uVar39 * 4 + (ulong)(iVar22 + SUB84(RVar10,0) + 2U >> 1) * 0x60) *
                   0x30 + (long)pvVar27);
        iVar23 = ChooseLeaf(pRtree,pRVar25,iHeight,(RtreeNode **)local_c8);
        pNode_01 = local_c8;
        if (iVar23 == 0) {
          iVar24 = rtreeInsertCell(pRtree,(RtreeNode *)local_c8,pRVar25,iHeight);
          iVar23 = nodeRelease(pRtree,(RtreeNode *)pNode_01);
          if (iVar24 != 0) {
            iVar23 = iVar24;
          }
        }
      } while ((iVar23 == 0) && (bVar42 = uVar39 < uVar33, uVar39 = uVar39 + 1, bVar42));
    }
    sqlite3_free(pvVar27);
    return iVar23;
  }
  lVar38 = (ulong)pNode->zData[2] << 8;
  bVar7 = pNode->zData[3];
  local_e8 = (ulong)bVar7;
  iVar22 = (int)lVar38;
  uVar41 = iVar22 + (uint)bVar7 + 1;
  uVar39 = (ulong)uVar41;
  iVar23 = sqlite3_initialize();
  if (iVar23 == 0) {
    pRVar25 = (RtreeCell *)sqlite3Malloc(uVar39 * 0x34);
  }
  else {
    pRVar25 = (RtreeCell *)0x0;
  }
  if (pRVar25 == (RtreeCell *)0x0) {
    pNode_02 = (RtreeNode *)0x0;
    pRVar26 = (RtreeNode *)0x0;
  }
  else {
    uVar33 = iVar22 + (int)local_e8;
    local_98 = lVar38;
    memset((void *)((long)pRVar25->aCoord + ((ulong)(uVar41 * 0x30) - 8)),0,(ulong)(uVar41 * 4));
    if (uVar33 != 0) {
      iVar22 = (int)local_98;
      iVar23 = (int)local_e8;
      uVar40 = 0;
      pRVar35 = pRVar25;
      do {
        nodeGetCell(pRtree,pNode,(int)uVar40,pRVar35);
        uVar40 = uVar40 + 1;
        pRVar35 = pRVar35 + 1;
      } while ((uint)(iVar22 + iVar23) != uVar40);
    }
    memset(pNode->zData + 2,0,(long)pRtree->iNodeSize - 2);
    pNode->isDirty = 1;
    uVar40 = (ulong)(uVar33 * 0x30);
    iVar28 = local_128->iRowid;
    iVar17 = *(i64 *)local_128->aCoord;
    RVar13 = local_128->aCoord[2];
    RVar14 = local_128->aCoord[3];
    RVar15 = local_128->aCoord[4];
    RVar16 = local_128->aCoord[5];
    uVar18 = *(undefined8 *)(local_128->aCoord + 8);
    puVar2 = (undefined8 *)((long)pRVar25->aCoord + uVar40 + 0x18);
    *puVar2 = *(undefined8 *)(local_128->aCoord + 6);
    puVar2[1] = uVar18;
    pRVar3 = (RtreeCoord *)((long)pRVar25->aCoord + uVar40 + 8);
    *pRVar3 = RVar13;
    pRVar3[1] = RVar14;
    pRVar3[2] = RVar15;
    pRVar3[3] = RVar16;
    piVar1 = (i64 *)((long)pRVar25->aCoord + (uVar40 - 8));
    *piVar1 = iVar28;
    piVar1[1] = iVar17;
    if (pNode->iNode == 1) {
      pRVar26 = nodeNew(pRtree,pNode);
      pNode_02 = nodeNew(pRtree,pNode);
      iVar22 = pRtree->iDepth + 1;
      pRtree->iDepth = iVar22;
      pNode->isDirty = 1;
      uVar32 = (ushort)iVar22;
      *(ushort *)pNode->zData = uVar32 << 8 | uVar32 >> 8;
    }
    else {
      pRVar26 = nodeNew(pRtree,pNode->pParent);
      pNode->nRef = pNode->nRef + 1;
      pNode_02 = pNode;
    }
    if (pRVar26 != (RtreeNode *)0x0 && pNode_02 != (RtreeNode *)0x0) {
      memset(pNode_02->zData,0,(long)pRtree->iNodeSize);
      memset(pRVar26->zData,0,(long)pRtree->iNodeSize);
      n = ((ulong)(uVar41 * 4) + 8) * ((ulong)pRtree->nDim + 1);
      iVar22 = sqlite3_initialize();
      if (iVar22 == 0) {
        pvVar27 = sqlite3Malloc(n);
      }
      else {
        pvVar27 = (void *)0x0;
      }
      if (pvVar27 == (void *)0x0) {
        iVar22 = 7;
      }
      else {
        bVar7 = pRtree->nDim;
        local_90 = pRVar26;
        memset(pvVar27,0,n);
        bVar30 = pRtree->nDim;
        uVar40 = (ulong)bVar30;
        if (bVar30 != 0) {
          uVar34 = 0;
          pvVar37 = pvVar27;
          do {
            uVar40 = (ulong)(uint)((int)uVar40 << 3);
            piVar36 = (int *)((long)pvVar27 + uVar34 * uVar39 * 4 + uVar40);
            *(int **)((long)pvVar27 + uVar34 * 8) = piVar36;
            uVar31 = 0;
            do {
              *(int *)((long)pvVar37 + uVar31 * 4 + uVar40) = (int)uVar31;
              uVar31 = uVar31 + 1;
            } while (uVar39 != uVar31);
            SortByDimension(pRtree,piVar36,uVar41,(int)uVar34,pRVar25,
                            (int *)((long)pvVar27 + (ulong)(bVar7 * uVar41) * 4 + (ulong)bVar7 * 8))
            ;
            uVar34 = uVar34 + 1;
            bVar30 = pRtree->nDim;
            uVar40 = (ulong)bVar30;
            pvVar37 = (void *)((long)pvVar37 + (ulong)(uVar41 * 4));
          } while (uVar34 < uVar40);
        }
        uVar39 = 0;
        if (bVar30 == 0) {
          local_160 = 0;
        }
        else {
          iVar22 = (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell;
          local_58 = (ulong)(uint)(iVar22 / 3);
          iVar23 = (int)((ulong)((long)iVar22 * 0x55555555) >> 0x20) - iVar22;
          local_d4 = (iVar23 >> 1) - (iVar23 >> 0x1f);
          local_88 = (long)(iVar22 / 3);
          local_cc = uVar41 + local_d4 + 1;
          local_d4 = local_d4 + uVar41;
          local_60 = (ulong)bVar30;
          uVar40 = 0;
          iVar22 = 0;
          dVar43 = 0.0;
          local_40 = (ulong)uVar33;
          do {
            local_13c = 0;
            dVar12 = 0.0;
            local_d0 = iVar22;
            local_50 = dVar43;
            local_48 = uVar39;
            if ((int)local_58 <= local_d4) {
              local_80 = 0.0;
              local_13c = 0;
              dVar43 = 0.0;
              lVar38 = local_88;
              dVar12 = 0.0;
              do {
                uVar39 = local_40;
                piVar36 = *(int **)((long)pvVar27 + uVar40 * 8);
                iVar22 = *piVar36;
                local_118 = (undefined1  [8])pRVar25[iVar22].iRowid;
                uStack_110 = *(undefined8 *)pRVar25[iVar22].aCoord;
                local_108 = *(undefined8 *)(pRVar25[iVar22].aCoord + 2);
                uStack_100 = *(undefined8 *)(pRVar25[iVar22].aCoord + 2 + 2);
                local_f8 = *(undefined8 *)(pRVar25[iVar22].aCoord + 6);
                aRStack_f0 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 6 + 2);
                iVar22 = piVar36[local_40];
                local_c8 = (undefined1  [8])pRVar25[iVar22].iRowid;
                _RStack_c0 = *(undefined8 *)pRVar25[iVar22].aCoord;
                local_b8 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 2);
                aRStack_b0 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 2 + 2);
                local_a8 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 6);
                aRStack_a0 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 6 + 2);
                if (1 < uVar33) {
                  uVar34 = 1;
                  do {
                    pRVar35 = (RtreeCell *)local_c8;
                    if ((long)uVar34 < lVar38) {
                      pRVar35 = (RtreeCell *)local_118;
                    }
                    cellUnion(pRtree,pRVar35,
                              pRVar25 + *(int *)(*(long *)((long)pvVar27 + uVar40 * 8) + uVar34 * 4)
                             );
                    uVar34 = uVar34 + 1;
                  } while (uVar39 != uVar34);
                }
                local_120 = cellMargin(pRtree,(RtreeCell *)local_118);
                local_e0 = cellMargin(pRtree,(RtreeCell *)local_c8);
                local_78 = 1.0;
                if ((ulong)pRtree->nDim2 != 0) {
                  uVar8 = pRtree->eCoordType;
                  local_78 = 1.0;
                  uVar39 = 2;
                  do {
                    if (uVar8 == '\0') {
                      fVar4 = *(float *)(local_118 + uVar39 * 4);
                      fVar5 = *(float *)(local_c8 + uVar39 * 4);
                    }
                    else {
                      fVar4 = (float)*(int *)(local_118 + uVar39 * 4);
                      fVar5 = (float)*(int *)(local_c8 + uVar39 * 4);
                    }
                    if (fVar4 <= fVar5) {
                      if (uVar8 == '\0') {
                        dVar9 = (double)*(float *)(local_c8 + uVar39 * 4);
                      }
                      else {
                        dVar9 = (double)*(int *)(local_c8 + uVar39 * 4);
                      }
                    }
                    else if (uVar8 == '\0') {
                      dVar9 = (double)*(float *)(local_118 + uVar39 * 4);
                    }
                    else {
                      dVar9 = (double)*(int *)(local_118 + uVar39 * 4);
                    }
                    if (uVar8 == '\0') {
                      fVar4 = *(float *)(local_118 + uVar39 * 4 + 4);
                      fVar5 = *(float *)(local_c8 + uVar39 * 4 + 4);
                    }
                    else {
                      fVar4 = (float)*(int *)(local_118 + uVar39 * 4 + 4);
                      fVar5 = (float)*(int *)(local_c8 + uVar39 * 4 + 4);
                    }
                    if (fVar5 <= fVar4) {
                      if (uVar8 == '\0') {
                        dVar11 = (double)*(float *)(local_c8 + uVar39 * 4 + 4);
                      }
                      else {
                        dVar11 = (double)*(int *)(local_c8 + uVar39 * 4 + 4);
                      }
                    }
                    else if (uVar8 == '\0') {
                      dVar11 = (double)*(float *)(local_118 + uVar39 * 4 + 4);
                    }
                    else {
                      dVar11 = (double)*(int *)(local_118 + uVar39 * 4 + 4);
                    }
                    local_78 = (double)((ulong)(local_78 * (dVar11 - dVar9)) &
                                       -(ulong)(dVar9 <= dVar11));
                  } while ((dVar9 <= dVar11) &&
                          (bVar42 = uVar39 < pRtree->nDim2, uVar39 = uVar39 + 2, bVar42));
                  local_78 = local_78 + 0.0;
                }
                uStack_70 = 0;
                local_38 = cellArea(pRtree,(RtreeCell *)local_118);
                RVar10 = cellArea(pRtree,(RtreeCell *)local_c8);
                if ((lVar38 == local_88) || (local_78 < dVar43)) {
LAB_001ccff0:
                  local_13c = (int)lVar38;
                  dVar43 = local_78;
                  local_80 = RVar10 + local_38;
                }
                else if ((local_78 == dVar43) &&
                        ((!NAN(local_78) && !NAN(dVar43) && (RVar10 + local_38 < local_80))))
                goto LAB_001ccff0;
                dVar12 = dVar12 + local_120 + local_e0;
                lVar38 = lVar38 + 1;
              } while (local_cc != (int)lVar38);
            }
            uVar34 = local_48;
            dVar43 = local_50;
            iVar22 = local_d0;
            if (dVar12 < local_50 || uVar40 == 0) {
              uVar34 = uVar40;
              dVar43 = dVar12;
              iVar22 = local_13c;
            }
            uVar39 = uVar34 & 0xffffffff;
            uVar40 = uVar40 + 1;
          } while (uVar40 != local_60);
          local_160 = (long)(int)uVar34;
          uVar39 = (ulong)iVar22;
        }
        piVar36 = *(int **)((long)pvVar27 + local_160 * 8);
        iVar22 = *piVar36;
        local_118 = (undefined1  [8])pRVar25[iVar22].iRowid;
        uStack_110 = *(undefined8 *)pRVar25[iVar22].aCoord;
        local_108 = *(undefined8 *)(pRVar25[iVar22].aCoord + 2);
        uStack_100 = *(undefined8 *)(pRVar25[iVar22].aCoord + 2 + 2);
        local_f8 = *(undefined8 *)(pRVar25[iVar22].aCoord + 6);
        aRStack_f0 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 6 + 2);
        iVar22 = piVar36[uVar39];
        local_c8 = (undefined1  [8])pRVar25[iVar22].iRowid;
        _RStack_c0 = *(undefined8 *)pRVar25[iVar22].aCoord;
        local_b8 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 2);
        aRStack_b0 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 2 + 2);
        local_a8 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 6);
        aRStack_a0 = *(RtreeCoord (*) [2])(pRVar25[iVar22].aCoord + 6 + 2);
        iVar22 = (int)local_98;
        iVar23 = (int)local_e8;
        uVar40 = 0;
        do {
          pRVar26 = local_90;
          if ((long)uVar40 < (long)uVar39) {
            pRVar26 = pNode_02;
          }
          pRVar35 = (RtreeCell *)local_c8;
          if ((long)uVar40 < (long)uVar39) {
            pRVar35 = (RtreeCell *)local_118;
          }
          iVar24 = *(int *)(*(long *)((long)pvVar27 + local_160 * 8) + uVar40 * 4);
          nodeInsertCell(pRtree,pRVar26,pRVar25 + iVar24);
          cellUnion(pRtree,pRVar35,pRVar25 + iVar24);
          uVar40 = uVar40 + 1;
        } while (iVar22 + iVar23 + 1 != uVar40);
        sqlite3_free(pvVar27);
        iVar22 = 0;
        pRVar26 = local_90;
      }
      if (((pvVar27 != (void *)0x0) && (iVar22 = nodeWrite(pRtree,pRVar26), iVar22 == 0)) &&
         ((pNode_02->iNode != 0 || (iVar22 = nodeWrite(pRtree,pNode_02), iVar22 == 0)))) {
        local_c8 = (undefined1  [8])pRVar26->iNode;
        local_118 = (undefined1  [8])pNode_02->iNode;
        pNode_00 = pNode_02->pParent;
        if (pNode->iNode == 1) {
          iVar22 = rtreeInsertCell(pRtree,pNode_00,(RtreeCell *)local_118,iHeight + 1);
        }
        else {
          if (pNode_00 == (RtreeNode *)0x0) {
            local_12c = -1;
            iVar22 = 0;
          }
          else {
            iVar22 = nodeRowidIndex(pRtree,pNode_00,(i64)local_118,&local_12c);
          }
          if (iVar22 == 0) {
            nodeOverwriteCell(pRtree,pNode_00,(RtreeCell *)local_118,local_12c);
            iVar22 = AdjustTree(pRtree,pNode_00,(RtreeCell *)local_118);
          }
        }
        if ((iVar22 == 0) &&
           (iVar22 = rtreeInsertCell(pRtree,pRVar26->pParent,(RtreeCell *)local_c8,iHeight + 1),
           iVar22 == 0)) {
          puVar29 = pRVar26->zData;
          if ((*(ushort *)(puVar29 + 2) & 0xff) == 0 && *(ushort *)(puVar29 + 2) >> 8 == 0) {
            bVar42 = true;
          }
          else {
            uVar41 = 0;
            bVar42 = false;
            do {
              iVar28 = readInt64(puVar29 + (ulong)(pRtree->nBytesPerCell * uVar41) + 4);
              iVar22 = updateMapping(pRtree,iVar28,pRVar26,iHeight);
              if (iVar22 != 0) goto LAB_001cd373;
              if (iVar28 == local_128->iRowid) {
                bVar42 = true;
              }
              uVar41 = uVar41 + 1;
              puVar29 = pRVar26->zData;
            } while (uVar41 < (ushort)(*(ushort *)(puVar29 + 2) << 8 | *(ushort *)(puVar29 + 2) >> 8
                                      ));
            bVar42 = !bVar42;
          }
          iVar22 = 0;
          if (pNode->iNode == 1) {
            puVar29 = pNode_02->zData;
            if ((*(ushort *)(puVar29 + 2) & 0xff) != 0 || *(ushort *)(puVar29 + 2) >> 8 != 0) {
              uVar41 = 0;
              do {
                iVar28 = readInt64(puVar29 + (ulong)(pRtree->nBytesPerCell * uVar41) + 4);
                iVar22 = updateMapping(pRtree,iVar28,pNode_02,iHeight);
                if (iVar22 != 0) goto LAB_001cd373;
                uVar41 = uVar41 + 1;
                puVar29 = pNode_02->zData;
              } while (uVar41 < (ushort)(*(ushort *)(puVar29 + 2) << 8 |
                                        *(ushort *)(puVar29 + 2) >> 8));
              iVar22 = 0;
            }
          }
          else if (bVar42) {
            iVar22 = updateMapping(pRtree,local_128->iRowid,pNode_02,iHeight);
          }
          if (iVar22 == 0) {
            iVar22 = nodeRelease(pRtree,pRVar26);
            pRVar26 = (RtreeNode *)0x0;
          }
          if (iVar22 == 0) {
            iVar22 = nodeRelease(pRtree,pNode_02);
            pNode_02 = (RtreeNode *)0x0;
          }
        }
      }
      goto LAB_001cd373;
    }
  }
  iVar22 = 7;
LAB_001cd373:
  nodeRelease(pRtree,pRVar26);
  nodeRelease(pRtree,pNode_02);
  sqlite3_free(pRVar25);
  return iVar22;
}

Assistant:

static int rtreeInsertCell(
  Rtree *pRtree,
  RtreeNode *pNode,
  RtreeCell *pCell,
  int iHeight
){
  int rc = SQLITE_OK;
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, pCell->iRowid);
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  if( nodeInsertCell(pRtree, pNode, pCell) ){
    if( iHeight<=pRtree->iReinsertHeight || pNode->iNode==1){
      rc = SplitNode(pRtree, pNode, pCell, iHeight);
    }else{
      pRtree->iReinsertHeight = iHeight;
      rc = Reinsert(pRtree, pNode, pCell, iHeight);
    }
  }else{
    rc = AdjustTree(pRtree, pNode, pCell);
    if( rc==SQLITE_OK ){
      if( iHeight==0 ){
        rc = rowidWrite(pRtree, pCell->iRowid, pNode->iNode);
      }else{
        rc = parentWrite(pRtree, pCell->iRowid, pNode->iNode);
      }
    }
  }
  return rc;
}